

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

int quantize_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  float fVar1;
  code *pcVar2;
  int iVar3;
  
  if (field == 1) {
    if (*value == '\x01') {
      pcVar2 = quantize_segment_mix_bypass;
    }
    else {
      pcVar2 = (code *)&LAB_001050a0;
    }
    segment->mix = pcVar2;
    return 1;
  }
  if (field == 0x28) {
    *(float *)((long)segment->data + 0x10) = (float)*value;
LAB_00142f04:
    iVar3 = 1;
  }
  else {
    if (field == 0x29) {
      fVar1 = *value;
      if ((0.0 <= fVar1) && (fVar1 <= 1.0)) {
        *(float *)((long)segment->data + 0x14) = fVar1;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          pcVar2 = (code *)&LAB_001050a0;
        }
        else {
          pcVar2 = quantize_segment_mix_bypass;
        }
        segment->mix = pcVar2;
        goto LAB_00142f04;
      }
      iVar3 = 8;
    }
    else {
      iVar3 = 7;
    }
    mixed_err(iVar3);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int quantize_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct quantize_segment_data *data = (struct quantize_segment_data *)segment->data;
  switch(field){
  case MIXED_MIX:
    if(*(float *)value < 0 || 1 < *(float *)value){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->mix = *(float *)value;
    if(data->mix == 0){
      bool bypass = 1;
      return quantize_segment_set(MIXED_BYPASS, &bypass, segment);
    }else{
      bool bypass = 0;
      return quantize_segment_set(MIXED_BYPASS, &bypass, segment);
    }
    break;
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = quantize_segment_mix_bypass;
    }else{
      segment->mix = quantize_segment_mix;
    }
    break;
  case MIXED_QUANTIZE_STEPS:
    data->steps = *(uint32_t *)value;
    break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}